

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O3

bool __thiscall crnlib::lzma_codec::pack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uchar *p_00;
  uint uVar6;
  int iVar7;
  ulong local_60;
  ulong local_58;
  uchar *local_50;
  ulong local_48;
  lzma_codec *local_40;
  size_t local_38;
  
  if (n < 0x40000001) {
    uVar6 = 0x80;
    if (0x80 < n >> 8) {
      uVar6 = n >> 8;
    }
    uVar5 = uVar6 + n + 0x14;
    uVar1 = buf->m_size;
    local_50 = (uchar *)p;
    local_40 = this;
    if (uVar1 != uVar5) {
      if (uVar1 <= uVar5) {
        if (buf->m_capacity < uVar5) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)buf,uVar5,uVar1 == uVar6 + n + 0x13,1,(object_mover)0x0,
                     false);
          uVar1 = buf->m_size;
        }
        memset(buf->m_p + uVar1,0,(ulong)(uVar5 - uVar1));
      }
      buf->m_size = uVar5;
    }
    p_00 = buf->m_p;
    p_00[0] = '\0';
    p_00[1] = '\0';
    p_00[2] = '\0';
    p_00[3] = '\0';
    p_00[4] = '\0';
    p_00[5] = '\0';
    p_00[6] = '\0';
    p_00[7] = '\0';
    p_00[8] = '\0';
    p_00[9] = '\0';
    p_00[10] = '\0';
    p_00[0xb] = '\0';
    p_00[0xc] = '\0';
    p_00[0xd] = '\0';
    p_00[0xe] = '\0';
    p_00[0xf] = '\0';
    p_00[0x10] = '\0';
    p_00[0x11] = '\0';
    p_00[0x12] = '\0';
    p_00[0x13] = '\0';
    lVar3 = 0xc;
    uVar4 = n;
    do {
      p_00[lVar3] = (uchar)(uVar4 >> 0x18);
      uVar4 = uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    local_48 = (ulong)n;
    uVar4 = adler32(local_50,local_48,1);
    lVar3 = 0x10;
    do {
      p_00[lVar3] = (uchar)(uVar4 >> 0x18);
      uVar4 = uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x14);
    if (n == 0) {
LAB_0012ce18:
      p_00[0] = '0';
      p_00[1] = 'L';
      uVar4 = adler32(p_00 + 3,0x11,1);
      p_00[2] = (uchar)uVar4;
      return true;
    }
    local_58 = (ulong)(n + 1 >> 1);
    iVar7 = 3;
    uVar6 = uVar6 + n + 0x14;
    do {
      local_60 = (ulong)(uVar6 - 0x14);
      local_38 = 5;
      iVar2 = (*local_40->m_pCompress)
                        (p_00 + 0x14,&local_60,local_50,local_48,p_00 + 3,&local_38,-1,0,-1,-1,-1,-1
                         ,1);
      if (iVar2 != 7) {
        if (iVar2 == 0) {
          lVar3 = 8;
          iVar7 = (int)local_60;
          do {
            p_00[lVar3] = (uchar)((uint)iVar7 >> 0x18);
            iVar7 = iVar7 << 8;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0xc);
          uVar6 = (int)local_60 + 0x14;
          uVar1 = buf->m_size;
          if (uVar1 != uVar6) {
            if (uVar1 <= uVar6) {
              if (buf->m_capacity < uVar6) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)buf,uVar6,uVar1 == (int)local_60 + 0x13U,1,
                           (object_mover)0x0,false);
                uVar1 = buf->m_size;
              }
              memset(buf->m_p + uVar1,0,(ulong)(uVar6 - uVar1));
            }
            buf->m_size = uVar6;
          }
          goto LAB_0012ce18;
        }
        p_00 = buf->m_p;
        break;
      }
      uVar5 = (int)local_58 + uVar6;
      uVar1 = buf->m_size;
      if (uVar5 != uVar1) {
        if (uVar1 <= uVar5) {
          if (buf->m_capacity < uVar5) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)buf,uVar5,((int)local_58 + uVar6) - 1 == uVar1,1,
                       (object_mover)0x0,false);
            uVar1 = buf->m_size;
          }
          memset(buf->m_p + uVar1,0,(ulong)(uVar5 - uVar1));
        }
        buf->m_size = uVar5;
      }
      p_00 = buf->m_p;
      iVar7 = iVar7 + -1;
      uVar6 = uVar5;
    } while (iVar7 != 0);
    if (p_00 != (uchar *)0x0) {
      crnlib_free(p_00);
      buf->m_p = (uchar *)0x0;
      buf->m_size = 0;
      buf->m_capacity = 0;
    }
  }
  return false;
}

Assistant:

bool lzma_codec::pack(const void* p, uint n, crnlib::vector<uint8>& buf)
    {
        if (n > 1024U * 1024U * 1024U)
        {
            return false;
        }

        uint max_comp_size = n + math::maximum<uint>(128, n >> 8);
        buf.resize(sizeof(header) + max_comp_size);

        header* pHDR = reinterpret_cast<header*>(&buf[0]);
        uint8* pComp_data = &buf[sizeof(header)];

        utils::zero_object(*pHDR);

        pHDR->m_uncomp_size = n;
        pHDR->m_adler32 = adler32(p, n);

        if (n)
        {
            size_t destLen = 0;
            size_t outPropsSize = 0;
            int status = SZ_ERROR_INPUT_EOF;

            for (uint trial = 0; trial < 3; trial++)
            {
                destLen = max_comp_size;
                outPropsSize = cLZMAPropsSize;

                status = (*m_pCompress)(pComp_data, &destLen, reinterpret_cast<const unsigned char*>(p), n,
                    pHDR->m_lzma_props, &outPropsSize,
                    -1, /* 0 <= level <= 9, default = 5 */
                    0, /* default = (1 << 24) */
                    -1, /* 0 <= lc <= 8, default = 3  */
                    -1, /* 0 <= lp <= 4, default = 0  */
                    -1, /* 0 <= pb <= 4, default = 2  */
                    -1, /* 5 <= fb <= 273, default = 32 */
#ifdef WIN32
                    (g_number_of_processors > 1) ? 2 : 1
#else
                    1
#endif
                );

                if (status != SZ_ERROR_OUTPUT_EOF)
                {
                    break;
                }

                max_comp_size += ((n + 1) / 2);
                buf.resize(sizeof(header) + max_comp_size);
                pHDR = reinterpret_cast<header*>(&buf[0]);
                pComp_data = &buf[sizeof(header)];
            }

            if (status != SZ_OK)
            {
                buf.clear();
                return false;
            }

            pHDR->m_comp_size = static_cast<uint>(destLen);

            buf.resize(CRNLIB_SIZEOF_U32(header) + static_cast<uint32>(destLen));
        }

        pHDR->m_sig = header::cSig;
        pHDR->m_checksum = static_cast<uint8>(adler32((uint8*)pHDR + header::cChecksumSkipBytes, sizeof(header) - header::cChecksumSkipBytes));

        return true;
    }